

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_near_optimal_merge_stats(libdeflate_compressor *c)

{
  long in_RDI;
  uint i;
  undefined4 local_c;
  
  merge_new_observations((block_split_stats *)(in_RDI + 0x528));
  for (local_c = 0; local_c < 0x103; local_c = local_c + 1) {
    *(int *)(in_RDI + 0x897dd8 + (ulong)local_c * 4) =
         *(int *)(in_RDI + 0x8979cc + (ulong)local_c * 4) +
         *(int *)(in_RDI + 0x897dd8 + (ulong)local_c * 4);
    *(undefined4 *)(in_RDI + 0x8979cc + (ulong)local_c * 4) = 0;
  }
  return;
}

Assistant:

static void
deflate_near_optimal_merge_stats(struct libdeflate_compressor *c)
{
	unsigned i;

	merge_new_observations(&c->split_stats);
	for (i = 0; i < ARRAY_LEN(c->p.n.match_len_freqs); i++) {
		c->p.n.match_len_freqs[i] += c->p.n.new_match_len_freqs[i];
		c->p.n.new_match_len_freqs[i] = 0;
	}
}